

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O3

void __thiscall
so_5::impl::coop_repository_basis_t::next_coop_reg_step__parent_child_relation
          (coop_repository_basis_t *this,coop_ref_t *coop_ref,coop_t *parent_coop_ptr)

{
  string *__a;
  string *__b;
  parent_child_coop_names_t names;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  if (parent_coop_ptr != (coop_t *)0x0) {
    __a = coop_t::query_coop_name_abi_cxx11_(parent_coop_ptr);
    __b = coop_t::query_coop_name_abi_cxx11_
                    ((coop_ref->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_68,__a,__b);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->m_parent_child_relations,&local_68);
    coop_t::do_registration_specific_actions
              ((coop_ref->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               parent_coop_ptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
      operator_delete(local_68.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
      operator_delete(local_68.first._M_dataplus._M_p);
    }
    return;
  }
  coop_t::do_registration_specific_actions
            ((coop_ref->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (coop_t *)0x0);
  return;
}

Assistant:

void
coop_repository_basis_t::next_coop_reg_step__parent_child_relation(
	const coop_ref_t & coop_ref,
	coop_t * parent_coop_ptr )
{
	auto do_actions = [&] {
			coop_private_iface_t::do_registration_specific_actions(
				*coop_ref, parent_coop_ptr );
		};

	if( parent_coop_ptr )
	{
		const parent_child_coop_names_t names{
				parent_coop_ptr->query_coop_name(),
				coop_ref->query_coop_name() };

		m_parent_child_relations.insert( names );

		// In case of error cooperation relation info should be removed
		// from m_parent_child_relations.
		so_5::details::do_with_rollback_on_exception(
			[&] { do_actions(); },
			[&] { m_parent_child_relations.erase( names ); } );
	}
	else
		// It is a very simple case. There is no need for additional
		// actions and rollback on exceptions.
		do_actions();
}